

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O1

TimingControl *
slang::ast::Delay3Control::fromSyntax
          (Compilation *compilation,Delay3Syntax *syntax,ASTContext *context)

{
  Expression *pEVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  SourceLocation SVar4;
  Diagnostic *diag;
  InvalidTimingControl *pIVar5;
  Expression *expr3;
  Expression *expr2;
  Expression *local_40;
  Expression *local_38;
  SourceRange local_30;
  Expression *args;
  
  iVar3 = Expression::bind((int)(syntax->delay1).ptr,(sockaddr *)context,0);
  args = (Expression *)CONCAT44(extraout_var,iVar3);
  local_38 = (Expression *)0x0;
  if (syntax->delay2 != (ExpressionSyntax *)0x0) {
    iVar3 = Expression::bind((int)syntax->delay2,(sockaddr *)context,0);
    local_38 = (Expression *)CONCAT44(extraout_var_00,iVar3);
  }
  local_40 = (Expression *)0x0;
  if (syntax->delay3 != (ExpressionSyntax *)0x0) {
    iVar3 = Expression::bind((int)syntax->delay3,(sockaddr *)context,0);
    local_40 = (Expression *)CONCAT44(extraout_var_01,iVar3);
  }
  local_30 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  SVar4 = (SourceLocation)
          BumpAllocator::
          emplace<slang::ast::Delay3Control,slang::ast::Expression_const&,slang::ast::Expression_const*&,slang::ast::Expression_const*&,slang::SourceRange>
                    (&compilation->super_BumpAllocator,args,&local_38,&local_40,&local_30);
  bVar2 = Expression::bad(args);
  if (!bVar2) {
    if (local_38 != (Expression *)0x0) {
      bVar2 = Expression::bad(local_38);
      if (bVar2) goto LAB_003d2549;
    }
    if (local_40 != (Expression *)0x0) {
      bVar2 = Expression::bad(local_40);
      if (bVar2) goto LAB_003d2549;
    }
    bVar2 = Type::isNumeric((args->type).ptr);
    pEVar1 = local_38;
    if ((bVar2) &&
       ((local_38 == (Expression *)0x0 ||
        (bVar2 = Type::isNumeric((local_38->type).ptr), args = pEVar1, bVar2)))) {
      args = local_40;
      if (local_40 == (Expression *)0x0) {
        return (TimingControl *)SVar4;
      }
      bVar2 = Type::isNumeric((local_40->type).ptr);
      if (bVar2) {
        return (TimingControl *)SVar4;
      }
    }
    diag = ASTContext::addDiag(context,(DiagCode)0x140008,args->sourceRange);
    ast::operator<<(diag,(args->type).ptr);
  }
LAB_003d2549:
  local_30.startLoc = SVar4;
  pIVar5 = BumpAllocator::
           emplace<slang::ast::InvalidTimingControl,slang::ast::TimingControl_const*&>
                     (&compilation->super_BumpAllocator,(TimingControl **)&local_30);
  return &pIVar5->super_TimingControl;
}

Assistant:

TimingControl& Delay3Control::fromSyntax(Compilation& compilation, const Delay3Syntax& syntax,
                                         const ASTContext& context) {
    auto& expr1 = Expression::bind(*syntax.delay1, context);

    const Expression* expr2 = nullptr;
    if (syntax.delay2)
        expr2 = &Expression::bind(*syntax.delay2, context);

    const Expression* expr3 = nullptr;
    if (syntax.delay3)
        expr3 = &Expression::bind(*syntax.delay3, context);

    auto result = compilation.emplace<Delay3Control>(expr1, expr2, expr3, syntax.sourceRange());
    if (expr1.bad() || (expr2 && expr2->bad()) || (expr3 && expr3->bad()))
        return badCtrl(compilation, result);

    auto checkType = [&](const Expression& expr) {
        if (!expr.type->isNumeric()) {
            context.addDiag(diag::DelayNotNumeric, expr.sourceRange) << *expr.type;
            return false;
        }
        return true;
    };

    if (!checkType(expr1) || (expr2 && !checkType(*expr2)) || (expr3 && !checkType(*expr3)))
        return badCtrl(compilation, result);

    return *result;
}